

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

int __thiscall
CVmObjDict::getp_set_comparator(CVmObjDict *this,vm_obj_id_t self,vm_val_t *val,uint *argc)

{
  char *pcVar1;
  int iVar2;
  dict_undo_rec *rec;
  vm_val_t *this_00;
  vm_obj_id_t obj;
  
  if (getp_set_comparator(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_set_comparator(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar2 != 0) {
      getp_set_comparator::desc.min_argc_ = 1;
      getp_set_comparator::desc.opt_argc_ = 0;
      getp_set_comparator::desc.varargs_ = 0;
      __cxa_guard_release(&getp_set_comparator(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  this_00 = val;
  iVar2 = CVmObject::get_prop_check_argc(val,argc,&getp_set_comparator::desc);
  if (iVar2 == 0) {
    obj = 0;
    if (sp_[-1].typ != VM_NIL) {
      if (sp_[-1].typ != VM_OBJ) {
        err_throw(0x900);
      }
      obj = sp_[-1].val.obj;
    }
    if (G_undo_X != (CVmUndo *)0x0) {
      rec = alloc_undo_rec((CVmObjDict *)this_00,DICT_UNDO_COMPARATOR,(char *)0x0,0);
      rec->obj = *(vm_obj_id_t *)((this->super_CVmObject).ext_ + 0x20);
      add_undo_rec((CVmObjDict *)this_00,self,rec);
    }
    set_comparator(this,obj);
    pcVar1 = (this->super_CVmObject).ext_;
    pcVar1[0x18] = '\x01';
    pcVar1[0x19] = '\0';
    pcVar1[0x1a] = '\0';
    pcVar1[0x1b] = '\0';
    pcVar1[0x1c] = '\0';
    pcVar1[0x1d] = '\0';
    pcVar1[0x1e] = '\0';
    pcVar1[0x1f] = '\0';
    sp_ = sp_ + -1;
    val->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_set_comparator(VMG_ vm_obj_id_t self, vm_val_t *val,
                                    uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    vm_obj_id_t comp;
    
    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* get the comparator object */
    switch(G_stk->get(0)->typ)
    {
    case VM_NIL:
        comp = VM_INVALID_OBJ;
        break;

    case VM_OBJ:
        comp = G_stk->get(0)->val.obj;
        break;

    default:
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* if there's a global undo object, add undo for the change */
    if (G_undo != 0)
    {
        dict_undo_rec *undo_rec;

        /* create an undo record with the original comparator */
        undo_rec = alloc_undo_rec(DICT_UNDO_COMPARATOR, 0, 0);
        undo_rec->obj = get_ext()->comparator_;

        /* add the undo record */
        add_undo_rec(vmg_ self, undo_rec);
    }

    /* set our new comparator object */
    set_comparator(vmg_ comp);

    /* mark the object as modified since load */
    get_ext()->modified_ = TRUE;

    /* discard arguments */
    G_stk->discard();

    /* no return value - just return nil */
    val->set_nil();

    /* handled */
    return TRUE;
}